

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void Fossilize::StreamArchive::convert_from_le(uint32_t *output,uint8_t *le_input,uint word_count)

{
  uint local_20;
  uint32_t v;
  uint i;
  uint word_count_local;
  uint8_t *le_input_local;
  uint32_t *output_local;
  
  _i = le_input;
  le_input_local = (uint8_t *)output;
  for (local_20 = 0; local_20 < word_count; local_20 = local_20 + 1) {
    *(undefined4 *)le_input_local = *(undefined4 *)_i;
    _i = _i + 4;
    le_input_local = le_input_local + 4;
  }
  return;
}

Assistant:

static void convert_from_le(uint32_t *output, const uint8_t *le_input, unsigned word_count)
	{
		for (unsigned i = 0; i < word_count; i++)
		{
			uint32_t v =
					(uint32_t(le_input[0]) << 0) |
					(uint32_t(le_input[1]) << 8) |
					(uint32_t(le_input[2]) << 16) |
					(uint32_t(le_input[3]) << 24);

			*output++ = v;
			le_input += 4;
		}
	}